

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O1

int XUtf8TextWidth(XUtf8FontStruct *font_set,char *string,int num_bytes)

{
  XFontStruct **ppXVar1;
  uint ucs_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  XFontStruct **ppXVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  char glyph [2];
  uint ucs;
  XChar2b buf [128];
  undefined2 local_1a0;
  unsigned_short local_19e;
  uint local_19c;
  XFontStruct **local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  int local_170;
  int local_16c;
  int *local_168;
  uchar *local_160;
  int *local_158;
  ulong local_150;
  long local_148;
  int *local_140;
  undefined2 local_138 [132];
  
  uVar8 = (ulong)font_set->nb_font;
  if ((long)uVar8 < 1) {
LAB_001fd99a:
    iVar2 = 0;
  }
  else {
    local_168 = font_set->encodings;
    ppXVar1 = font_set->fonts;
    iVar2 = 0;
    if (*ppXVar1 == (XFontStruct *)0x0) {
      uVar7 = 0;
      do {
        if (uVar8 - 1 == uVar7) goto LAB_001fd99a;
        uVar11 = uVar7 + 1;
        lVar12 = uVar7 + 1;
        uVar7 = uVar11;
      } while (ppXVar1[lVar12] == (XFontStruct *)0x0);
      bVar13 = uVar11 < uVar8;
    }
    else {
      bVar13 = true;
      uVar11 = 0;
    }
    if (bVar13) {
      ppXVar10 = ppXVar1;
      uVar7 = uVar11;
      local_160 = (uchar *)string;
      if (num_bytes < 1) {
        uVar6 = 0;
        iVar4 = 0;
      }
      else {
        local_150 = uVar11 & 0xffffffff;
        local_140 = local_168 + uVar11;
        local_158 = font_set->ranges + uVar11 * 2 + 1;
        uVar5 = 0;
        uVar6 = 0;
        local_198 = ppXVar1;
        local_190 = uVar11;
        local_188 = uVar8;
        do {
          local_170 = (int)uVar7;
          local_148 = (long)local_170;
          local_180 = uVar5;
          if (0x78 < (int)uVar6) {
            iVar2 = XTextWidth16(ppXVar10[local_148],local_138);
            local_178 = 0;
            local_180 = (ulong)(uint)((int)local_180 + iVar2);
            uVar6 = local_178;
          }
          local_178 = uVar6;
          local_16c = num_bytes;
          uVar3 = XFastConvertUtf8ToUcs(local_160,num_bytes,&local_19c);
          if ((int)uVar3 < 2) {
            uVar3 = 1;
          }
          local_19e = XUtf8IsNonSpacing(local_19c);
          iVar2 = (int)local_188;
          uVar9 = (uint)local_190;
          if (local_19e != 0) {
            local_19c = (uint)local_19e;
          }
          ucs_00 = local_19c;
          uVar7 = local_190 & 0xffffffff;
          if ((int)uVar9 < iVar2) {
            lVar12 = 0;
            do {
              if (ppXVar1[uVar11 + lVar12] != (XFontStruct *)0x0) {
                iVar2 = local_140[lVar12];
                iVar4 = ucs2fontmap((char *)&local_1a0,ucs_00,iVar2);
                if ((-1 < iVar4) &&
                   ((iVar2 != 0 ||
                    ((local_158[lVar12 * 2 + -1] <= (int)ucs_00 &&
                     ((int)ucs_00 <= local_158[lVar12 * 2])))))) {
                  uVar9 = (uint)local_190;
                  uVar7 = (ulong)((int)lVar12 + uVar9);
                  iVar2 = (int)local_188;
                  ppXVar10 = local_198;
                  goto LAB_001fd8c2;
                }
              }
              lVar12 = lVar12 + 1;
            } while ((uVar11 - uVar8) + lVar12 != 0);
            iVar2 = (int)local_188;
            uVar7 = local_188 & 0xffffffff;
            uVar9 = (uint)local_190;
            ppXVar10 = local_198;
          }
LAB_001fd8c2:
          if ((int)uVar7 == iVar2) {
            ucs2fontmap((char *)&local_1a0,0x3f,local_168[local_150]);
            uVar7 = (ulong)uVar9;
          }
          if ((local_19e == 0) && (local_170 == (int)uVar7)) {
            local_138[(int)local_178] = local_1a0;
            uVar6 = (ulong)((int)local_178 + 1);
            uVar5 = local_180 & 0xffffffff;
          }
          else {
            iVar2 = XTextWidth16(ppXVar10[local_148],local_138,local_178);
            ppXVar10 = local_198;
            uVar9 = iVar2 + (int)local_180;
            uVar5 = (ulong)uVar9;
            local_138[0] = local_1a0;
            if (local_19e == 0) {
              uVar6 = 1;
            }
            else {
              iVar2 = XTextWidth16(local_198[(int)uVar7],local_138,1);
              uVar6 = 1;
              uVar5 = (ulong)(uVar9 - iVar2);
            }
          }
          local_160 = local_160 + uVar3;
          iVar4 = (int)uVar5;
          num_bytes = local_16c - uVar3;
        } while (num_bytes != 0 && (int)uVar3 <= local_16c);
      }
      iVar2 = XTextWidth16(ppXVar10[(int)uVar7],local_138,uVar6);
      iVar2 = iVar2 + iVar4;
    }
  }
  return iVar2;
}

Assistant:

int
XUtf8TextWidth(XUtf8FontStruct 	*font_set,
	       const char 	*string,
	       int 		num_bytes) {

  int		x;
  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[128];   /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		i;          /* current byte in the XChar2b buffer */
  int 		first;      /* first valid font index */
  int 		last_fnum;  /* font index of the previous char */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */

  nb_font = font_set->nb_font;
  x = 0;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return x;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return x;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** measure the buffer **/
      x += XTextWidth16(fonts[fnum], buf, i);
      i = 0;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) {
      ucs = no_spc;
    }

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] &&
	     (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      x += XTextWidth16(fonts[last_fnum], buf, i);
      i = 0;
      (*buf).byte1 = glyph[0];
      (*buf).byte2 = glyph[1];
      if (no_spc) {
	/* go back to draw the non-spacing char over the previous char */
	x -= XTextWidth16(fonts[fnum], buf, 1);
      }
    } else {
      (*(buf + i)).byte1 = glyph[0];
      (*(buf + i)).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  x += XTextWidth16(fonts[last_fnum], buf, i);

  return x;
}